

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageSetter.h
# Opt level: O0

void __thiscall
jaegertracing::baggage::BaggageSetter::
setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
          (BaggageSetter *this,Span *span,StrMap *baggage,string *key,string *value,
          _func_void___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
          *logFn)

{
  RestrictionManager *pRVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int extraout_var;
  Counter *pCVar6;
  pointer ppVar7;
  mapped_type *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prevItem;
  iterator itr;
  string local_98;
  string local_68 [36];
  Restriction local_44;
  Restriction restriction;
  bool truncated;
  _func_void___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  *logFn_local;
  string *value_local;
  string *key_local;
  StrMap *baggage_local;
  Span *span_local;
  BaggageSetter *this_local;
  
  restriction._3_1_ = 0;
  pRVar1 = this->_restrictionManager;
  unique0x10000412 = logFn;
  jaegertracing::Span::serviceNameNoLock_abi_cxx11_();
  local_44._0_4_ = (*pRVar1->_vptr_RestrictionManager[2])(pRVar1,local_68,key);
  local_44._maxValueLength = extraout_var;
  std::__cxx11::string::~string(local_68);
  bVar3 = Restriction::keyAllowed(&local_44);
  if (bVar3) {
    iVar4 = std::__cxx11::string::size();
    iVar5 = Restriction::maxValueLength(&local_44);
    if (iVar5 < iVar4) {
      restriction._3_1_ = 1;
      Restriction::maxValueLength(&local_44);
      std::__cxx11::string::substr((ulong)&itr,(ulong)value);
      std::__cxx11::string::operator=((string *)value,(string *)&itr);
      std::__cxx11::string::~string((string *)&itr);
      pCVar6 = metrics::Metrics::baggageTruncate(this->_metrics);
      (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    }
    prevItem.field_2._8_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(baggage,key);
    local_e8._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                   (baggage);
    bVar3 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)((long)&prevItem.field_2 + 8),&local_e8);
    if (bVar3) {
      std::__cxx11::string::string((string *)local_e0);
    }
    else {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)((long)&prevItem.field_2 + 8));
      std::__cxx11::string::string((string *)local_e0,(string *)&ppVar7->second);
    }
    local_f0._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                   (baggage);
    bVar3 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)((long)&prevItem.field_2 + 8),&local_f0);
    if (bVar3) {
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](baggage,key);
      std::__cxx11::string::operator=((string *)this_00,(string *)value);
    }
    else {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)((long)&prevItem.field_2 + 8));
      std::__cxx11::string::operator=((string *)&ppVar7->second,(string *)value);
    }
    uVar2 = restriction._3_1_;
    bVar3 = Restriction::keyAllowed(&local_44);
    logFields<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
              (this,span,key,value,(string *)local_e0,(bool)(uVar2 & 1),bVar3,
               stack0xffffffffffffffc8);
    pCVar6 = metrics::Metrics::baggageUpdateSuccess(this->_metrics);
    (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    std::__cxx11::string::~string((string *)local_e0);
  }
  else {
    std::__cxx11::string::string((string *)&local_98);
    uVar2 = restriction._3_1_;
    bVar3 = Restriction::keyAllowed(&local_44);
    logFields<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
              (this,span,key,value,&local_98,(bool)(uVar2 & 1),bVar3,stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&local_98);
    pCVar6 = metrics::Metrics::baggageUpdateFailure(this->_metrics);
    (*pCVar6->_vptr_Counter[2])(pCVar6,1);
  }
  return;
}

Assistant:

void setBaggage(Span& span,
                    SpanContext::StrMap& baggage,
                    const std::string& key,
                    std::string value,
                    LoggingFunction logFn) const
    {
        auto truncated = false;
        const auto restriction =
            _restrictionManager.getRestriction(span.serviceNameNoLock(), key);
        if (!restriction.keyAllowed()) {
            logFields(span,
                      key,
                      value,
                      std::string(),
                      truncated,
                      restriction.keyAllowed(),
                      logFn);
            _metrics.baggageUpdateFailure().inc(1);
            return;
        }

        if (static_cast<int>(value.size()) > restriction.maxValueLength()) {
            truncated = true;
            value = value.substr(0, restriction.maxValueLength());
            _metrics.baggageTruncate().inc(1);
        }

        auto itr = baggage.find(key);
        const auto prevItem =
            (itr == std::end(baggage) ? std::string() : itr->second);
        if (itr == std::end(baggage)) {
            baggage[key] = value;
        }
        else {
            itr->second = value;
        }
        logFields(span,
                  key,
                  value,
                  prevItem,
                  truncated,
                  restriction.keyAllowed(),
                  logFn);
        _metrics.baggageUpdateSuccess().inc(1);
    }